

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

int errorlist_add_va(ErrorList *list,char *_fname,int errpos,char *fmt,__va_list_tag *va)

{
  MOJOSHADER_malloc p_Var1;
  uint uVar2;
  ErrorItem *pEVar3;
  size_t sVar4;
  char *__s;
  char *failstr;
  undefined8 uStack_e8;
  int len;
  va_list ap;
  char local_c8 [8];
  char scratch [128];
  char *fname;
  ErrorItem *error;
  __va_list_tag *va_local;
  char *fmt_local;
  int errpos_local;
  char *_fname_local;
  ErrorList *list_local;
  
  pEVar3 = (ErrorItem *)(*list->m)(0x20,list->d);
  if (pEVar3 == (ErrorItem *)0x0) {
    list_local._4_4_ = 0;
  }
  else {
    scratch[0x78] = '\0';
    scratch[0x79] = '\0';
    scratch[0x7a] = '\0';
    scratch[0x7b] = '\0';
    scratch[0x7c] = '\0';
    scratch[0x7d] = '\0';
    scratch[0x7e] = '\0';
    scratch[0x7f] = '\0';
    if (_fname != (char *)0x0) {
      p_Var1 = list->m;
      sVar4 = strlen(_fname);
      scratch._120_8_ = (*p_Var1)((int)sVar4 + 1,list->d);
      if ((char *)scratch._120_8_ == (char *)0x0) {
        (*list->f)(pEVar3,list->d);
        return 0;
      }
      strcpy((char *)scratch._120_8_,_fname);
    }
    ap[0].overflow_arg_area = va->reg_save_area;
    uStack_e8._0_4_ = va->gp_offset;
    uStack_e8._4_4_ = va->fp_offset;
    ap[0]._0_8_ = va->overflow_arg_area;
    uVar2 = vsnprintf(local_c8,0x80,fmt,&uStack_e8);
    __s = (char *)(*list->m)(uVar2 + 1,list->d);
    if (__s == (char *)0x0) {
      (*list->f)(pEVar3,list->d);
      (*list->f)((void *)scratch._120_8_,list->d);
      list_local._4_4_ = 0;
    }
    else {
      if (uVar2 < 0x80) {
        strcpy(__s,local_c8);
      }
      else {
        ap[0].overflow_arg_area = va->reg_save_area;
        uStack_e8._0_4_ = va->gp_offset;
        uStack_e8._4_4_ = va->fp_offset;
        ap[0]._0_8_ = va->overflow_arg_area;
        vsnprintf(__s,(long)(int)(uVar2 + 1),fmt,&uStack_e8);
      }
      (pEVar3->error).error = __s;
      (pEVar3->error).filename = (char *)scratch._120_8_;
      (pEVar3->error).error_position = errpos;
      pEVar3->next = (ErrorItem *)0x0;
      list->tail->next = pEVar3;
      list->tail = pEVar3;
      list->count = list->count + 1;
      list_local._4_4_ = 1;
    }
  }
  return list_local._4_4_;
}

Assistant:

int errorlist_add_va(ErrorList *list, const char *_fname,
                     const int errpos, const char *fmt, va_list va)
{
    ErrorItem *error = (ErrorItem *) list->m(sizeof (ErrorItem), list->d);
    if (error == NULL)
        return 0;

    char *fname = NULL;
    if (_fname != NULL)
    {
        fname = (char *) list->m(strlen(_fname) + 1, list->d);
        if (fname == NULL)
        {
            list->f(error, list->d);
            return 0;
        } // if
        strcpy(fname, _fname);
    } // if

    char scratch[128];
    va_list ap;
    va_copy(ap, va);
    int len = vsnprintf(scratch, sizeof (scratch), fmt, ap);
    va_end(ap);

    // on some versions of the windows C runtime, vsnprintf() returns -1
    // if the buffer overflows instead of the length the string would have
    // been as expected.
    // In this case we make another copy of va and fetch the length only
    // with another call to _vscprintf

#ifdef _MSC_VER
    if (len == -1)
    {
        va_copy(ap, va);
        len = _vscprintf(fmt, ap);
        va_end(ap);
    }
#endif

    char *failstr = (char *) list->m(len + 1, list->d);
    if (failstr == NULL)
    {
        list->f(error, list->d);
        list->f(fname, list->d);
        return 0;
    } // if

    // If we overflowed our scratch buffer, that's okay. We were going to
    //  allocate anyhow...the scratch buffer just lets us avoid a second
    //  run of vsnprintf().
    if (len < sizeof (scratch))
        strcpy(failstr, scratch);  // copy it over.
    else
    {
        va_copy(ap, va);
        vsnprintf(failstr, len + 1, fmt, ap);  // rebuild it.
        va_end(ap);
    } // else

    error->error.error = failstr;
    error->error.filename = fname;
    error->error.error_position = errpos;
    error->next = NULL;

    list->tail->next = error;
    list->tail = error;

    list->count++;
    return 1;
}